

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::ExactCompareLineDistance(Vector3_xf *x,Vector3_xf *a0,Vector3_xf *a1,ExactFloat *r2)

{
  ExactFloat *b;
  bool bVar1;
  ExactFloat local_140;
  ExactFloat local_130;
  ExactFloat local_120;
  ExactFloat local_110;
  ExactFloat local_100;
  undefined1 local_f0 [8];
  ExactFloat cmp;
  ExactFloat local_d0;
  ExactFloat local_c0;
  ExactFloat local_b0;
  undefined1 local_a0 [8];
  ExactFloat sin2_r;
  ExactFloat sin_d;
  Vector3_xf n;
  ExactFloat local_40;
  ExactFloat *local_30;
  ExactFloat *r2_local;
  Vector3_xf *a1_local;
  Vector3_xf *a0_local;
  Vector3_xf *x_local;
  
  local_30 = r2;
  r2_local = a1->c_;
  a1_local = a0;
  a0_local = x;
  ExactFloat::ExactFloat(&local_40,2.0);
  bVar1 = operator>=(r2,&local_40);
  ExactFloat::~ExactFloat(&local_40);
  if (bVar1) {
    x_local._4_4_ = -1;
  }
  else {
    Vector3<ExactFloat>::CrossProd
              ((Vector3<ExactFloat> *)&sin_d.bn_,a1_local,(Vector3<ExactFloat> *)r2_local);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&sin2_r.bn_,a0_local);
    b = local_30;
    ExactFloat::ExactFloat(&local_c0,1);
    ExactFloat::ExactFloat((ExactFloat *)&cmp.bn_,0.25);
    ::operator*(&local_d0,(ExactFloat *)&cmp.bn_);
    ::operator-(&local_b0,&local_c0);
    ::operator*((ExactFloat *)local_a0,b);
    ExactFloat::~ExactFloat(&local_b0);
    ExactFloat::~ExactFloat(&local_d0);
    ExactFloat::~ExactFloat((ExactFloat *)&cmp.bn_);
    ExactFloat::~ExactFloat(&local_c0);
    ::operator*(&local_100,(ExactFloat *)&sin2_r.bn_);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_130);
    ::operator*(&local_120,(ExactFloat *)local_a0);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_140);
    ::operator*(&local_110,&local_120);
    ::operator-((ExactFloat *)local_f0,&local_100);
    ExactFloat::~ExactFloat(&local_110);
    ExactFloat::~ExactFloat(&local_140);
    ExactFloat::~ExactFloat(&local_120);
    ExactFloat::~ExactFloat(&local_130);
    ExactFloat::~ExactFloat(&local_100);
    x_local._4_4_ = ExactFloat::sgn((ExactFloat *)local_f0);
    ExactFloat::~ExactFloat((ExactFloat *)local_f0);
    ExactFloat::~ExactFloat((ExactFloat *)local_a0);
    ExactFloat::~ExactFloat((ExactFloat *)&sin2_r.bn_);
    Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)&sin_d.bn_);
  }
  return x_local._4_4_;
}

Assistant:

int ExactCompareLineDistance(const Vector3_xf& x, const Vector3_xf& a0,
                             const Vector3_xf& a1, const ExactFloat& r2) {
  // Since we are given that the closest point is in the edge interior, the
  // true distance is always less than 90 degrees (which corresponds to a
  // squared chord length of 2.0).
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise compute the edge normal
  Vector3_xf n = a0.CrossProd(a1);
  ExactFloat sin_d = x.DotProd(n);
  ExactFloat sin2_r = r2 * (1 - 0.25 * r2);
  ExactFloat cmp = sin_d * sin_d - sin2_r * x.Norm2() * n.Norm2();
  return cmp.sgn();
}